

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O2

GLboolean glewGetExtension(char *name)

{
  GLboolean GVar1;
  GLuint GVar2;
  GLubyte *s;
  
  s = (GLubyte *)glGetString(0x1f03);
  if (s != (GLubyte *)0x0) {
    GVar2 = _glewStrLen(s);
    GVar1 = _glewSearchExtension(name,s,s + GVar2);
    return GVar1;
  }
  return '\0';
}

Assistant:

GLboolean GLEWAPIENTRY glewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;
  start = (const GLubyte*)glGetString(GL_EXTENSIONS);
  if (start == 0)
    return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}